

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O3

void __thiscall
HVectorBase<double>::saxpy<double,double>
          (HVectorBase<double> *this,double pivotX,HVectorBase<double> *pivot)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  iVar8 = this->count;
  iVar2 = pivot->count;
  if (0 < (long)iVar2) {
    piVar4 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pivot->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pivot->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      iVar3 = piVar6[lVar9];
      dVar12 = pdVar5[iVar3];
      dVar1 = pdVar7[iVar3];
      if ((dVar12 == 0.0) && (!NAN(dVar12))) {
        lVar10 = (long)iVar8;
        iVar8 = iVar8 + 1;
        piVar4[lVar10] = iVar3;
      }
      dVar12 = dVar1 * pivotX + dVar12;
      uVar11 = -(ulong)(ABS(dVar12) < 1e-14);
      pdVar5[iVar3] = (double)(~uVar11 & (ulong)dVar12 | uVar11 & 0x358dee7a4ad4b81f);
      lVar9 = lVar9 + 1;
    } while (iVar2 != lVar9);
  }
  this->count = iVar8;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}